

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O0

void __thiscall
icu_63::DateTimePatternGenerator::AppendItemFormatsSink::put
          (AppendItemFormatsSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  UBool UVar1;
  UnicodeString *this_00;
  UnicodeString local_a8;
  UnicodeString *local_68;
  UnicodeString *valueStr;
  UDateTimePatternField field;
  int32_t i;
  ResourceTable itemsTable;
  UErrorCode *errorCode_local;
  UBool param_3_local;
  ResourceValue *value_local;
  char *key_local;
  AppendItemFormatsSink *this_local;
  
  itemsTable._32_8_ = errorCode;
  value_local = (ResourceValue *)key;
  key_local = (char *)this;
  (*(value->super_UObject)._vptr_UObject[0xb])(&field,value,errorCode);
  UVar1 = ::U_FAILURE(*(UErrorCode *)itemsTable._32_8_);
  if (UVar1 == '\0') {
    valueStr._4_4_ = 0;
    while (UVar1 = ResourceTable::getKeyAndValue
                             ((ResourceTable *)&field,valueStr._4_4_,(char **)&value_local,value),
          UVar1 != '\0') {
      valueStr._0_4_ = getAppendFormatNumber(this->dtpg,(char *)value_local);
      if ((UDateTimePatternField)valueStr != UDATPG_FIELD_COUNT) {
        ResourceValue::getUnicodeString(&local_a8,value,(UErrorCode *)itemsTable._32_8_);
        local_68 = &local_a8;
        this_00 = getAppendItemFormat(this->dtpg,(UDateTimePatternField)valueStr);
        UVar1 = icu_63::UnicodeString::isEmpty(this_00);
        if ((UVar1 != '\0') && (UVar1 = icu_63::UnicodeString::isEmpty(local_68), UVar1 == '\0')) {
          setAppendItemFormat(this->dtpg,(UDateTimePatternField)valueStr,local_68);
        }
        icu_63::UnicodeString::~UnicodeString(&local_a8);
      }
      valueStr._4_4_ = valueStr._4_4_ + 1;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable itemsTable = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int32_t i = 0; itemsTable.getKeyAndValue(i, key, value); ++i) {
            UDateTimePatternField field = dtpg.getAppendFormatNumber(key);
            if (field == UDATPG_FIELD_COUNT) { continue; }
            const UnicodeString& valueStr = value.getUnicodeString(errorCode);
            if (dtpg.getAppendItemFormat(field).isEmpty() && !valueStr.isEmpty()) {
                dtpg.setAppendItemFormat(field, valueStr);
            }
        }
    }